

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *tm)

{
  int iVar1;
  size_t sStack_40;
  uchar tag;
  size_t year_len;
  size_t len;
  mbedtls_x509_time *pmStack_28;
  int ret;
  mbedtls_x509_time *tm_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_4_ = 0xffffff92;
  pmStack_28 = tm;
  tm_local = (mbedtls_x509_time *)end;
  end_local = (uchar *)p;
  if ((long)end - (long)*p < 1) {
    p_local._4_4_ =
         mbedtls_error_add(-0x2400,-0x60,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                           ,0x292);
  }
  else {
    if (**p == '\x17') {
      sStack_40 = 2;
    }
    else {
      if (**p != '\x18') {
        iVar1 = mbedtls_error_add(-0x2400,-0x62,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                                  ,0x29d);
        return iVar1;
      }
      sStack_40 = 4;
    }
    *p = *p + 1;
    len._4_4_ = mbedtls_asn1_get_len(p,end,&year_len);
    if (len._4_4_ == 0) {
      if ((year_len == sStack_40 + 10) ||
         ((year_len == sStack_40 + 0xb && (*(char *)(*(long *)end_local + (year_len - 1)) == 'Z'))))
      {
        *(size_t *)end_local = year_len + *(long *)end_local;
        p_local._4_4_ =
             x509_parse_time((uchar *)(*(long *)end_local - year_len),pmStack_28,sStack_40);
      }
      else {
        p_local._4_4_ = -0x2400;
      }
    }
    else {
      p_local._4_4_ =
           mbedtls_error_add(-0x2400,len._4_4_,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509.c"
                             ,0x2a4);
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_x509_get_time(unsigned char **p, const unsigned char *end,
                          mbedtls_x509_time *tm)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len, year_len;
    unsigned char tag;

    if ((end - *p) < 1) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE,
                                 MBEDTLS_ERR_ASN1_OUT_OF_DATA);
    }

    tag = **p;

    if (tag == MBEDTLS_ASN1_UTC_TIME) {
        year_len = 2;
    } else if (tag == MBEDTLS_ASN1_GENERALIZED_TIME) {
        year_len = 4;
    } else {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE,
                                 MBEDTLS_ERR_ASN1_UNEXPECTED_TAG);
    }

    (*p)++;
    ret = mbedtls_asn1_get_len(p, end, &len);

    if (ret != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE, ret);
    }

    /* len is 12 or 14 depending on year_len, plus optional trailing 'Z' */
    if (len != year_len + 10 &&
        !(len == year_len + 11 && (*p)[(len - 1)] == 'Z')) {
        return MBEDTLS_ERR_X509_INVALID_DATE;
    }

    (*p) += len;
    return x509_parse_time(*p - len, tm, year_len);
}